

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O1

void VP8CalculateLevelCosts(VP8EncProba *proba)

{
  byte bVar1;
  uint16_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint8_t (*pauVar6) [11];
  long lVar7;
  uint16_t **ppuVar8;
  uint16_t uVar9;
  uint8_t *puVar10;
  CostArray *paauVar11;
  long lVar12;
  uint16_t (*pauVar13) [68];
  long lVar14;
  uint16_t (*pauVar15) [68];
  long lVar16;
  uint16_t **ppuVar17;
  short sVar18;
  CostArray (*paaauVar19) [8];
  uint8_t *puVar20;
  uint8_t *puVar21;
  uint8_t *puVar22;
  uint uVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  
  auVar4 = _DAT_00156820;
  auVar3 = _DAT_001555f0;
  if (proba->dirty_ != 0) {
    puVar22 = proba->coeffs_[0][0][0] + 2;
    ppuVar17 = proba->remapped_costs_[0][0] + 1;
    pauVar13 = proba->level_cost_[0][0] + 1;
    lVar12 = 0;
    paaauVar19 = proba->level_cost_;
    do {
      lVar7 = 0;
      puVar21 = puVar22;
      do {
        lVar14 = 0;
        puVar20 = puVar21;
        do {
          pauVar6 = proba->coeffs_[lVar12][lVar7] + lVar14;
          if (lVar14 == 0) {
            uVar9 = 0;
          }
          else {
            uVar9 = VP8EntropyCost[(*pauVar6)[0] ^ 0xff];
          }
          pauVar15 = proba->level_cost_[lVar12][lVar7] + lVar14;
          bVar1 = (*pauVar6)[1];
          uVar2 = VP8EntropyCost[(byte)~bVar1];
          (*pauVar15)[0] = uVar9 + VP8EntropyCost[bVar1];
          lVar16 = 1;
          do {
            uVar24 = (ulong)*(ushort *)(&DAT_0015b87c + lVar16 * 4);
            if (*(ushort *)(&DAT_0015b87c + lVar16 * 4) == 0) {
              sVar18 = 0;
            }
            else {
              uVar5 = (uint)*(ushort *)(&DAT_0015b87e + lVar16 * 4);
              sVar18 = 0;
              puVar10 = puVar20;
              do {
                if ((uVar24 & 1) != 0) {
                  sVar18 = sVar18 + VP8EntropyCost[(byte)(-((byte)uVar5 & 1) ^ *puVar10)];
                }
                uVar5 = uVar5 >> 1;
                uVar23 = (uint)uVar24;
                uVar24 = uVar24 >> 1;
                puVar10 = puVar10 + 1;
              } while (1 < uVar23);
            }
            (*pauVar15)[lVar16] = sVar18 + uVar2 + uVar9;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x44);
          lVar14 = lVar14 + 1;
          puVar20 = puVar20 + 0xb;
        } while (lVar14 != 3);
        lVar7 = lVar7 + 1;
        puVar21 = puVar21 + 0x21;
      } while (lVar7 != 8);
      lVar7 = 0;
      ppuVar8 = ppuVar17;
      do {
        pauVar15 = pauVar13 + (ulong)""[lVar7] * 3;
        paauVar11 = *paaauVar19 + ""[lVar7];
        lVar14 = 0;
        auVar25 = auVar3;
        do {
          if (SUB164(auVar25 ^ auVar4,4) == -0x80000000 && SUB164(auVar25 ^ auVar4,0) < -0x7ffffffd)
          {
            ppuVar8[lVar14 + -1] = (uint16_t *)paauVar11;
            ppuVar8[lVar14] = *pauVar15;
          }
          lVar14 = lVar14 + 2;
          lVar16 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 2;
          auVar25._8_8_ = lVar16 + 2;
          pauVar15 = pauVar15 + 2;
          paauVar11 = (CostArray *)(*paauVar11 + 2);
        } while (lVar14 != 4);
        lVar7 = lVar7 + 1;
        ppuVar8 = ppuVar8 + 3;
      } while (lVar7 != 0x10);
      lVar12 = lVar12 + 1;
      puVar22 = puVar22 + 0x108;
      ppuVar17 = ppuVar17 + 0x30;
      pauVar13 = pauVar13 + 0x18;
      paaauVar19 = paaauVar19 + 1;
    } while (lVar12 != 4);
    proba->dirty_ = 0;
  }
  return;
}

Assistant:

void VP8CalculateLevelCosts(VP8EncProba* const proba) {
  int ctype, band, ctx;

  if (!proba->dirty_) return;  // nothing to do.

  for (ctype = 0; ctype < NUM_TYPES; ++ctype) {
    int n;
    for (band = 0; band < NUM_BANDS; ++band) {
      for (ctx = 0; ctx < NUM_CTX; ++ctx) {
        const uint8_t* const p = proba->coeffs_[ctype][band][ctx];
        uint16_t* const table = proba->level_cost_[ctype][band][ctx];
        const int cost0 = (ctx > 0) ? VP8BitCost(1, p[0]) : 0;
        const int cost_base = VP8BitCost(1, p[1]) + cost0;
        int v;
        table[0] = VP8BitCost(0, p[1]) + cost0;
        for (v = 1; v <= MAX_VARIABLE_LEVEL; ++v) {
          table[v] = cost_base + VariableLevelCost(v, p);
        }
        // Starting at level 67 and up, the variable part of the cost is
        // actually constant.
      }
    }
    for (n = 0; n < 16; ++n) {    // replicate bands. We don't need to sentinel.
      for (ctx = 0; ctx < NUM_CTX; ++ctx) {
        proba->remapped_costs_[ctype][n][ctx] =
            proba->level_cost_[ctype][VP8EncBands[n]][ctx];
      }
    }
  }
  proba->dirty_ = 0;
}